

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::unserialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  int bit;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uchar bits;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  byte local_4a;
  ValueSerializer local_49;
  long local_48;
  size_type local_40;
  unsigned_long local_38;
  
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)this);
  bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,&local_38,4);
  if (((bVar2) && (local_38 == 0x13578642)) &&
     (bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,&local_40,8), bVar2)) {
    dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::clear_to_size((dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                     *)this,local_40);
    bVar2 = sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
                      ((_IO_FILE *)param_2,(unsigned_long *)(this + 0x58),8);
    if (bVar2) {
      if (*(long *)(this + 0x60) == 0) {
        return true;
      }
      lVar5 = 0;
      uVar6 = 0;
      while (sVar3 = fread(&local_4a,1,1,param_2), bVar1 = local_4a, sVar3 == 1) {
        lVar4 = 0;
        local_48 = lVar5;
        do {
          if (((uVar6 + lVar4 < *(ulong *)(this + 0x60)) &&
              ((bVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0)) &&
             (bVar2 = ValueSerializer::operator()
                                (&local_49,(_IO_FILE *)param_2,
                                 (pair<const_char_*const,_ValueType> *)
                                 (*(long *)(this + 0x78) + lVar5)), !bVar2)) {
            return false;
          }
          lVar4 = lVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar4 != 8);
        uVar6 = uVar6 + 8;
        lVar5 = local_48 + 0x80;
        if (*(ulong *)(this + 0x60) <= uVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }